

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O0

Result __thiscall wabt::WastParser::ParseEventModuleField(WastParser *this,Module *module)

{
  bool bVar1;
  pointer pEVar2;
  unique_ptr<wabt::EventModuleField,_std::default_delete<wabt::EventModuleField>_> local_70;
  Enum local_64;
  Enum local_60;
  Enum local_5c;
  undefined4 local_58;
  Enum local_54;
  Location local_50;
  unique_ptr<wabt::EventModuleField,_std::default_delete<wabt::EventModuleField>_> local_30;
  unique_ptr<wabt::EventModuleField,_std::default_delete<wabt::EventModuleField>_> field;
  Module *module_local;
  WastParser *this_local;
  
  field._M_t.
  super___uniq_ptr_impl<wabt::EventModuleField,_std::default_delete<wabt::EventModuleField>_>._M_t.
  super__Tuple_impl<0UL,_wabt::EventModuleField_*,_std::default_delete<wabt::EventModuleField>_>.
  super__Head_base<0UL,_wabt::EventModuleField_*,_false>._M_head_impl._4_4_ = Expect(this,Lpar);
  bVar1 = Failed(field._M_t.
                 super___uniq_ptr_impl<wabt::EventModuleField,_std::default_delete<wabt::EventModuleField>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_wabt::EventModuleField_*,_std::default_delete<wabt::EventModuleField>_>
                 .super__Head_base<0UL,_wabt::EventModuleField_*,_false>._M_head_impl._4_4_);
  if (bVar1) {
    Result::Result((Result *)((long)&this_local + 4),Error);
  }
  else {
    GetLocation(&local_50,this);
    MakeUnique<wabt::EventModuleField,wabt::Location>((wabt *)&local_30,&local_50);
    local_54 = (Enum)Expect(this,Event);
    bVar1 = Failed((Result)local_54);
    if (bVar1) {
      Result::Result((Result *)((long)&this_local + 4),Error);
    }
    else {
      pEVar2 = std::unique_ptr<wabt::EventModuleField,_std::default_delete<wabt::EventModuleField>_>
               ::operator->(&local_30);
      ParseBindVarOpt(this,&(pEVar2->event).name);
      pEVar2 = std::unique_ptr<wabt::EventModuleField,_std::default_delete<wabt::EventModuleField>_>
               ::operator->(&local_30);
      local_5c = (Enum)ParseTypeUseOpt(this,&(pEVar2->event).decl);
      bVar1 = Failed((Result)local_5c);
      if (bVar1) {
        Result::Result((Result *)((long)&this_local + 4),Error);
      }
      else {
        pEVar2 = std::
                 unique_ptr<wabt::EventModuleField,_std::default_delete<wabt::EventModuleField>_>::
                 operator->(&local_30);
        local_60 = (Enum)ParseUnboundFuncSignature(this,&(pEVar2->event).decl.sig);
        bVar1 = Failed((Result)local_60);
        if (bVar1) {
          Result::Result((Result *)((long)&this_local + 4),Error);
        }
        else {
          local_64 = (Enum)Expect(this,Rpar);
          bVar1 = Failed((Result)local_64);
          if (bVar1) {
            Result::Result((Result *)((long)&this_local + 4),Error);
          }
          else {
            std::unique_ptr<wabt::EventModuleField,_std::default_delete<wabt::EventModuleField>_>::
            unique_ptr(&local_70,&local_30);
            Module::AppendField(module,&local_70);
            std::unique_ptr<wabt::EventModuleField,_std::default_delete<wabt::EventModuleField>_>::
            ~unique_ptr(&local_70);
            Result::Result((Result *)((long)&this_local + 4),Ok);
          }
        }
      }
    }
    local_58 = 1;
    std::unique_ptr<wabt::EventModuleField,_std::default_delete<wabt::EventModuleField>_>::
    ~unique_ptr(&local_30);
  }
  return (Result)this_local._4_4_;
}

Assistant:

Result WastParser::ParseEventModuleField(Module* module) {
  WABT_TRACE(ParseEventModuleField);
  EXPECT(Lpar);
  auto field = MakeUnique<EventModuleField>(GetLocation());
  EXPECT(Event);
  ParseBindVarOpt(&field->event.name);
  CHECK_RESULT(ParseTypeUseOpt(&field->event.decl));
  CHECK_RESULT(ParseUnboundFuncSignature(&field->event.decl.sig));
  EXPECT(Rpar);
  module->AppendField(std::move(field));
  return Result::Ok;
}